

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

ISEParams tcu::astc::anon_unknown_0::computeMaximumRangeISEParams
                    (int numAvailableBits,int numValuesInSequence)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uStack_50;
  ISEParams params;
  uint local_38;
  
  uVar4 = 6;
  uVar6 = 8;
  local_38 = 5;
  do {
    uVar7 = ~(-1 << ((byte)uVar6 & 0x1f));
    if ((int)uVar6 < 1) {
      uVar7 = 0xffffffff;
    }
    while( true ) {
      uVar5 = (5 << ((byte)local_38 & 0x1f)) - 1;
      if ((int)local_38 < 1) {
        uVar5 = 0xffffffff;
      }
      while( true ) {
        uVar1 = (3 << ((byte)uVar4 & 0x1f)) - 1;
        if ((int)uVar4 < 1) {
          uVar1 = 0xffffffff;
        }
        uVar3 = uVar5;
        if ((int)uVar5 < (int)uVar1) {
          uVar3 = uVar1;
        }
        if ((int)uVar3 <= (int)uVar7) {
          uVar3 = uVar7;
        }
        if (uVar3 != uVar1) break;
        params.mode = ISEMODE_TRIT;
        params.numBits = uVar4;
        iVar2 = computeNumRequiredBits(&params,numValuesInSequence);
        if (iVar2 <= numAvailableBits) {
          uStack_50 = 0;
          uVar6 = uVar4;
          goto LAB_01620911;
        }
        uVar4 = uVar4 - 1;
      }
      if (uVar3 != uVar5) break;
      params.mode = ISEMODE_QUINT;
      params.numBits = local_38;
      iVar2 = computeNumRequiredBits(&params,numValuesInSequence);
      if (iVar2 <= numAvailableBits) {
        uStack_50 = 1;
        uVar6 = local_38;
        goto LAB_01620911;
      }
      local_38 = local_38 - 1;
    }
    params.mode = ISEMODE_PLAIN_BIT;
    params.numBits = uVar6;
    iVar2 = computeNumRequiredBits(&params,numValuesInSequence);
    if (iVar2 <= numAvailableBits) {
      uStack_50 = 2;
LAB_01620911:
      return (ISEParams)((ulong)uVar6 << 0x20 | uStack_50);
    }
    uVar6 = uVar6 - 1;
  } while( true );
}

Assistant:

ISEParams computeMaximumRangeISEParams (int numAvailableBits, int numValuesInSequence)
{
	int curBitsForTritMode		= 6;
	int curBitsForQuintMode		= 5;
	int curBitsForPlainBitMode	= 8;

	while (true)
	{
		DE_ASSERT(curBitsForTritMode > 0 || curBitsForQuintMode > 0 || curBitsForPlainBitMode > 0);

		const int tritRange			= curBitsForTritMode > 0		? (3 << curBitsForTritMode) - 1			: -1;
		const int quintRange		= curBitsForQuintMode > 0		? (5 << curBitsForQuintMode) - 1		: -1;
		const int plainBitRange		= curBitsForPlainBitMode > 0	? (1 << curBitsForPlainBitMode) - 1		: -1;
		const int maxRange			= de::max(de::max(tritRange, quintRange), plainBitRange);

		if (maxRange == tritRange)
		{
			const ISEParams params(ISEMODE_TRIT, curBitsForTritMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_TRIT, curBitsForTritMode);
			curBitsForTritMode--;
		}
		else if (maxRange == quintRange)
		{
			const ISEParams params(ISEMODE_QUINT, curBitsForQuintMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_QUINT, curBitsForQuintMode);
			curBitsForQuintMode--;
		}
		else
		{
			const ISEParams params(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			DE_ASSERT(maxRange == plainBitRange);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			curBitsForPlainBitMode--;
		}
	}
}